

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall CoreML::ShapeConstraint::copyFrom(ShapeConstraint *this,ShapeConstraint *other)

{
  ShapeRange local_38;
  
  ShapeRange::intersect(&local_38,&this->_sequenceRange,&other->_sequenceRange);
  (this->_sequenceRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_sequenceRange)._maximum._val = local_38._maximum._val;
  (this->_sequenceRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_sequenceRange)._minimum._val = local_38._minimum._val;
  ShapeRange::intersect(&local_38,&this->_batchRange,&other->_batchRange);
  (this->_batchRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_batchRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_batchRange)._maximum._val = local_38._maximum._val;
  (this->_batchRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_batchRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_batchRange)._minimum._val = local_38._minimum._val;
  ShapeRange::intersect(&local_38,&this->_channelRange,&other->_channelRange);
  (this->_channelRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_channelRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_channelRange)._maximum._val = local_38._maximum._val;
  (this->_channelRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_channelRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_channelRange)._minimum._val = local_38._minimum._val;
  ShapeRange::intersect(&local_38,&this->_heightRange,&other->_heightRange);
  (this->_heightRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_heightRange)._maximum._val = local_38._maximum._val;
  (this->_heightRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_heightRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_heightRange)._minimum._val = local_38._minimum._val;
  ShapeRange::intersect(&local_38,&this->_widthRange,&other->_widthRange);
  (this->_widthRange)._maximum._isUnbound = local_38._maximum._isUnbound;
  *(undefined7 *)&(this->_widthRange)._maximum.field_0x1 = local_38._maximum._1_7_;
  (this->_widthRange)._maximum._val = local_38._maximum._val;
  (this->_widthRange)._minimum._isUnbound = local_38._minimum._isUnbound;
  *(undefined7 *)&(this->_widthRange)._minimum.field_0x1 = local_38._minimum._1_7_;
  (this->_widthRange)._minimum._val = local_38._minimum._val;
  return;
}

Assistant:

void ShapeConstraint::copyFrom(const ShapeConstraint& other) {
    _sequenceRange = _sequenceRange.intersect(other.sequenceRange());
    _batchRange = _batchRange.intersect(other.batchRange());
    _channelRange = _channelRange.intersect(other.channelRange());
    _heightRange = _heightRange.intersect(other.heightRange());
    _widthRange = _widthRange.intersect(other.widthRange());
}